

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O1

object __thiscall
pybind11::detail::accessor_policies::str_attr::get(str_attr *this,handle obj,char *key)

{
  long lVar1;
  error_already_set *this_00;
  
  lVar1 = PyObject_GetAttrString(obj.m_ptr,key);
  if (lVar1 != 0) {
    *(long *)this = lVar1;
    return (object)(handle)this;
  }
  this_00 = (error_already_set *)__cxa_allocate_exception(0x18);
  error_already_set::error_already_set(this_00);
  __cxa_throw(this_00,&error_already_set::typeinfo,error_already_set::~error_already_set);
}

Assistant:

static object get(handle obj, const char *key) { return getattr(obj, key); }